

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

void __thiscall libtorrent::dht::rpc_manager::~rpc_manager(rpc_manager *this)

{
  __node_base *p_Var1;
  
  this->field_0xb7 = this->field_0xb7 | 0x80;
  p_Var1 = &(this->m_transactions)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    observer::abort(*(observer **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor);
  }
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->m_sock).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&(this->m_transactions)._M_h);
  boost::pool<libtorrent::aux::allocator_new_delete>::~pool(&this->m_pool_allocator);
  return;
}

Assistant:

rpc_manager::~rpc_manager()
{
	TORRENT_ASSERT(!m_destructing);
	m_destructing = true;

	for (auto const& t : m_transactions)
		t.second->abort();
}